

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoZ.cpp
# Opt level: O3

void __thiscall OpenMD::RhoZ::process(RhoZ *this)

{
  SelectionManager *this_00;
  long *plVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_01;
  char cVar2;
  SimInfo *info;
  Snapshot *this_02;
  pointer pvVar3;
  iterator __position;
  iterator __position_00;
  pointer pdVar4;
  RealType RVar5;
  double dVar6;
  double dVar7;
  StuntDouble *pSVar8;
  int iVar9;
  ulong uVar10;
  uint i_1;
  double *__args;
  SelectionSet *pSVar11;
  uint i;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  StuntDouble *sd;
  Vector3d pos;
  int ii;
  Mat3x3d hmat;
  DumpReader reader;
  StuntDouble *local_1328;
  int local_131c;
  SelectionSet local_1318;
  vector<double,std::allocator<double>> *local_12f8;
  SelectionEvaluator *local_12f0;
  ulong local_12e8;
  ulong local_12e0;
  int local_12d4;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar9 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar9 / (this->super_StaticAnalyser).step_;
  if (0 < iVar9) {
    local_12f8 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_12f0 = &this->evaluator_;
    this_00 = &this->seleMan_;
    uVar10 = 0;
    pSVar8 = local_1328;
    local_131c = iVar9;
    do {
      local_1328 = pSVar8;
      local_12e8 = uVar10;
      DumpReader::readFrame(&local_1288,(int)uVar10);
      this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_02;
      uVar10 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar10 != 0) {
        pvVar3 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = 0;
        do {
          lVar15 = *(long *)((long)&(pvVar3->
                                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar12);
          if (*(long *)((long)&(pvVar3->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar12) != lVar15) {
            *(long *)((long)&(pvVar3->
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + lVar12) = lVar15;
          }
          lVar12 = lVar12 + 0x18;
        } while (uVar10 * 0x18 != lVar12);
      }
      RVar5 = Snapshot::getVolume(this_02);
      local_12e0 = (ulong)(this->super_StaticAnalyser).nBins_;
      Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
      __args = (double *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_12f8,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1318,local_12f0);
        lVar12 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar12),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1318.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar12));
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1318.bitsets_);
        iVar9 = local_131c;
      }
      local_1328 = SelectionManager::beginSelected(this_00,&local_12d4);
      dVar6 = (double)(long)local_12e0;
      while (local_1328 != (StuntDouble *)0x0) {
        pSVar11 = (SelectionSet *)
                  ((long)local_1328->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1328->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1328->storage_)
                  );
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar11 != &local_1318) {
          lVar12 = 0;
          do {
            (&local_1318.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar12] =
                 (&(pSVar11->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
        }
        pSVar11 = (SelectionSet *)
                  ((long)local_1328->localIndex_ * 0x18 +
                  *(long *)((long)&(local_1328->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_1328->storage_)
                  );
        if (pSVar11 != &local_1318) {
          lVar12 = 0;
          do {
            (&(pSVar11->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar12] =
                 (&local_1318.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        local_1328 = SelectionManager::nextSelected(this_00,&local_12d4);
      }
      local_1328 = SelectionManager::beginSelected(this_00,&local_12d4);
      while (local_1328 != (StuntDouble *)0x0) {
        lVar12 = *(long *)((long)&(local_1328->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1328->storage_);
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar12 + 0x10 + (long)local_1328->localIndex_ * 0x18);
        plVar1 = (long *)(lVar12 + (long)local_1328->localIndex_ * 0x18);
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar1;
        local_1318.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar1[1];
        uVar13 = (this->super_StaticAnalyser).nBins_;
        this_01 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  ((this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  (int)((uint)(int)(((double)(&local_1318.bitsets_.
                                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                               ._M_impl.super__Vector_impl_data._M_start)
                                             [(uint)this->axis_] /
                                     *(double *)
                                      ((long)local_12d0.super_SquareMatrix<double,_3>.
                                             super_RectMatrix<double,_3U,_3U>.data_ +
                                      (ulong)(uint)this->axis_ * 0x20) + 0.5) * (double)uVar13) %
                       uVar13));
        __position_00._M_current = *(StuntDouble ***)(this_01 + 8);
        if (__position_00._M_current == *(StuntDouble ***)(this_01 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_01,__position_00,&local_1328);
        }
        else {
          *__position_00._M_current = local_1328;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
        local_1328 = SelectionManager::nextSelected(this_00,&local_12d4);
      }
      uVar10 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar10 != 0) {
        pvVar3 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar4 = (this->density_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = 0;
        do {
          lVar12 = *(long *)&pvVar3[uVar14].
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             ._M_impl.super__Vector_impl_data;
          lVar15 = (long)pvVar3[uVar14].
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - lVar12;
          if (lVar15 == 0) {
            dVar7 = 0.0;
          }
          else {
            dVar7 = 0.0;
            uVar16 = 0;
            do {
              dVar7 = dVar7 + *(double *)(*(long *)(lVar12 + uVar16 * 8) + 0x38);
              uVar16 = uVar16 + 1;
            } while ((uVar16 & 0xffffffff) < (ulong)(lVar15 >> 3));
          }
          pdVar4[uVar14] = dVar7 / (RVar5 / dVar6) + pdVar4[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar10);
      }
      uVar13 = (int)local_12e8 + (this->super_StaticAnalyser).step_;
      uVar10 = (ulong)uVar13;
      local_1328 = (StuntDouble *)0x0;
      pSVar8 = (StuntDouble *)0x0;
    } while ((int)uVar13 < iVar9);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RhoZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / nBins_;
      Mat3x3d hmat         = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      // RealType halfBoxZ_ = hmat(axis_,axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        // int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) /
        // hmat(axis_,axis_)); = int(nBins_ * ( 0.5 + pos[axis_] /
        // hmat(axis_,axis_) ) Shift molecules by half a box to have bins start
        // at 0 The modulo operator is used to wrap the case when we are beyond
        // the end of the bins back to the beginning. (from RNEMD.cpp)
        int binNo =
            int(nBins_ * (pos[axis_] / hmat(axis_, axis_) + 0.5)) % nBins_;
        sliceSDLists_[binNo].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType totalMass = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          totalMass += sliceSDLists_[i][k]->getMass();
        }
        density_[i] += totalMass / sliceVolume;
      }
    }

    writeDensity();
  }